

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::Fsmooth
          (MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *sol,MultiFab *rhs)

{
  Real RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  FabArray<amrex::IArrayBox> *this_00;
  pointer pIVar29;
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  int iVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  undefined8 *puVar39;
  double dVar40;
  long lVar41;
  double *pdVar42;
  int ns_2;
  long lVar43;
  int ns;
  int iVar44;
  MFIter *this_01;
  long lVar45;
  long *plVar46;
  long lVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  int ns_1;
  double dVar54;
  long lVar55;
  long lVar56;
  bool bVar57;
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  __uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> local_b60;
  double dStack_b30;
  Array4<const_double> local_ac0;
  undefined1 *local_a80;
  double *local_a78;
  undefined1 *local_a70;
  double *local_a68;
  double local_a60;
  double local_a58;
  double *local_a50;
  double local_a48;
  double *local_a40;
  double *local_a38;
  double local_a30;
  long local_a28;
  double *local_a20;
  double *local_a18;
  double *local_a10;
  double *local_a08;
  double *local_a00;
  double *local_9f8;
  double local_9f0;
  int local_9e4;
  Array4<const_double> local_9e0;
  long local_9a0;
  long local_998;
  double *local_990;
  double local_988;
  uint local_97c;
  uint local_978;
  uint local_974;
  int local_970;
  int local_96c;
  undefined1 local_968 [16];
  Array4<const_double> local_950;
  double local_910;
  Array4<const_int> local_908;
  MFIter mfi_2;
  Box local_834;
  double local_818;
  double dStack_810;
  undefined1 local_808 [16];
  double local_7f8;
  double dStack_7f0;
  ulong local_7e0;
  double *local_7d8;
  undefined1 *local_7d0;
  ulong local_7c8;
  long local_7c0;
  double local_7b8;
  long local_7b0;
  Array1D<double,_0,_31> u_ls;
  Array1D<double,_0,_31> r_ls;
  Array1D<double,_0,_31> c_ls;
  Array1D<double,_0,_31> a_ls;
  undefined1 local_2c8 [256];
  double local_1c8;
  double dStack_1c0;
  MFIter mfi;
  
  lVar49 = (long)mglev;
  lVar52 = *(long *)&(this->m_stencil).
                     super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  lVar41 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  pdVar42 = (double *)(lVar41 + 0x38 + lVar49 * 200);
  dVar40 = *pdVar42;
  dVar2 = pdVar42[1];
  dVar54 = *(double *)(lVar41 + 0x48 + lVar49 * 200);
  this_00 = *(FabArray<amrex::IArrayBox> **)
             (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                        super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             + lVar49 * 8);
  bVar57 = true;
  plVar46 = (long *)(lVar49 * 0x18 +
                    *(long *)&(this->m_sigma).
                              super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                              .
                              super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                    );
  local_9e4 = amrlev;
  if (0 < mglev && amrlev == 0) {
    pIVar29 = (this->super_MLNodeLinOp).super_MLLinOp.mg_coarsen_ratio_vec.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar57 = false;
    if ((pIVar29[(ulong)(uint)mglev - 1].vect[0] == 2) &&
       (pIVar29[(ulong)(uint)mglev - 1].vect[1] == 2)) {
      bVar57 = pIVar29[(ulong)(uint)mglev - 1].vect[2] == 2;
    }
    if ((!bVar57) && (*plVar46 == 0)) {
      Assert_host("regular_coarsening",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                  ,0x1a9,(char *)0x0);
    }
  }
  if (this->m_use_gauss_seidel != true) {
    a_ls.arr[0] = 4.94065645841247e-324;
    a_ls.arr[1] = 0.0;
    a_ls.arr[2] = 0.0;
    a_ls.arr[3] = 0.0;
    a_ls.arr[4] = 0.0;
    c_ls.arr[0] = (double)&PTR__FabFactory_007d2928;
    MultiFab::MultiFab((MultiFab *)&mfi,
                       &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                       &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1
                       ,0,(MFInfo *)&a_ls,(FabFactory<amrex::FArrayBox> *)&c_ls);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(a_ls.arr + 2));
    Fapply(this,local_9e4,mglev,(MultiFab *)&mfi,sol);
    if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
      MFIter::MFIter((MFIter *)&c_ls,(FabArrayBase *)sol,true);
      while (c_ls.arr[4]._0_4_ < c_ls.arr[5]._0_4_) {
        MFIter::tilebox((Box *)&local_ac0,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&u_ls,&sol->super_FabArray<amrex::FArrayBox>,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&r_ls,(FabArray<amrex::FArrayBox> *)&mfi,(MFIter *)&c_ls)
        ;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_2c8,&rhs->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&mfi_2,
                   *(FabArray<amrex::FArrayBox> **)(lVar52 + lVar49 * 8),(MFIter *)&c_ls);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_9e0,this_00,(MFIter *)&c_ls);
        a_ls.arr[4] = (double)CONCAT44(local_9e0.begin.y,local_9e0.begin.x);
        a_ls.arr._52_8_ = local_9e0._52_8_;
        a_ls.arr[2] = (double)local_9e0.kstride;
        a_ls.arr[3] = (double)local_9e0.nstride;
        a_ls.arr[0] = (double)local_9e0.p;
        a_ls.arr[1] = (double)local_9e0.jstride;
        a_ls.arr._116_8_ = u_ls.arr._52_8_;
        a_ls.arr[0xc] = u_ls.arr[4];
        a_ls.arr[10] = u_ls.arr[2];
        a_ls.arr[0xb] = u_ls.arr[3];
        a_ls.arr[8] = u_ls.arr[0];
        a_ls.arr[9] = u_ls.arr[1];
        a_ls.arr[0x14] = (double)CONCAT44(mfi_2.beginIndex,mfi_2.currentIndex);
        a_ls.arr[0x16]._4_4_ = mfi_2._52_4_;
        a_ls.arr[0x17]._0_4_ = (int)mfi_2.index_map;
        a_ls.arr[0x12] = (double)mfi_2.tile_size.vect._0_8_;
        a_ls.arr[0x13] = (double)mfi_2._24_8_;
        a_ls.arr[0x10] =
             (double)mfi_2.m_fa._M_t.
                     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        a_ls.arr[0x11] = (double)mfi_2.fabArray;
        a_ls.arr[0x1e]._4_4_ = (int)local_2c8._52_8_;
        a_ls.arr[0x1f]._0_4_ = SUB84(local_2c8._52_8_,4);
        a_ls.arr[0x1c]._0_4_ = (int)local_2c8._32_8_;
        a_ls.arr[0x1c]._4_4_ = SUB84(local_2c8._32_8_,4);
        a_ls.arr[0x1a] = (double)local_2c8._16_8_;
        a_ls.arr[0x1b] = (double)local_2c8._24_8_;
        a_ls.arr[0x18]._0_4_ = (int)local_2c8._0_8_;
        a_ls.arr[0x18]._4_4_ = SUB84(local_2c8._0_8_,4);
        a_ls.arr[0x19] = (double)local_2c8._8_8_;
        LoopConcurrent<amrex::mlndlap_jacobi_sten(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&)::_lambda(int,int,int)_1_>
                  ((Box *)&local_ac0,(anon_class_320_5_f501ae73 *)&a_ls);
        MFIter::operator++((MFIter *)&c_ls);
      }
    }
    else if (*plVar46 == 0) {
      MFIter::MFIter((MFIter *)&c_ls,(FabArrayBase *)sol,true);
      while (c_ls.arr[4]._0_4_ < c_ls.arr[5]._0_4_) {
        MFIter::tilebox((Box *)&local_9e0,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&u_ls,&sol->super_FabArray<amrex::FArrayBox>,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&r_ls,(FabArray<amrex::FArrayBox> *)&mfi,(MFIter *)&c_ls)
        ;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_2c8,&rhs->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&c_ls);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&mfi_2,this_00,(MFIter *)&c_ls);
        a_ls.arr[4] = (double)CONCAT44(mfi_2.beginIndex,mfi_2.currentIndex);
        a_ls.arr._52_8_ = mfi_2._52_8_;
        a_ls.arr[2] = (double)mfi_2.tile_size.vect._0_8_;
        a_ls.arr[3] = (double)mfi_2._24_8_;
        a_ls.arr[0] = (double)mfi_2.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        a_ls.arr[1] = (double)mfi_2.fabArray;
        a_ls.arr._116_8_ = u_ls.arr._52_8_;
        a_ls.arr[0xc] = u_ls.arr[4];
        a_ls.arr[10] = u_ls.arr[2];
        a_ls.arr[0xb] = u_ls.arr[3];
        a_ls.arr[8] = u_ls.arr[0];
        a_ls.arr[9] = u_ls.arr[1];
        a_ls.arr[0x16]._4_4_ = (int)local_2c8._52_8_;
        a_ls.arr[0x17]._0_4_ = SUB84(local_2c8._52_8_,4);
        a_ls.arr[0x14] = (double)local_2c8._32_8_;
        a_ls.arr[0x12] = (double)local_2c8._16_8_;
        a_ls.arr[0x13] = (double)local_2c8._24_8_;
        a_ls.arr[0x10] = (double)local_2c8._0_8_;
        a_ls.arr[0x11] = (double)local_2c8._8_8_;
        a_ls.arr[0x1e]._4_4_ = r_ls.arr[6]._4_4_;
        a_ls.arr[0x1f]._0_4_ = r_ls.arr[7]._0_4_;
        a_ls.arr[0x1c]._0_4_ = SUB84(r_ls.arr[4],0);
        a_ls.arr[0x1c]._4_4_ = (int)((ulong)r_ls.arr[4] >> 0x20);
        a_ls.arr[0x1a] = r_ls.arr[2];
        a_ls.arr[0x1b] = r_ls.arr[3];
        a_ls.arr[0x18]._0_4_ = SUB84(r_ls.arr[0],0);
        a_ls.arr[0x18]._4_4_ = (undefined4)((ulong)r_ls.arr[0] >> 0x20);
        a_ls.arr[0x19] = r_ls.arr[1];
        LoopConcurrent<amrex::mlndlap_jacobi_c(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                  ((Box *)&local_9e0,(anon_class_272_6_f7bd19c5 *)&a_ls);
        MFIter::operator++((MFIter *)&c_ls);
      }
    }
    else if (((mglev < 1) || (this->m_use_harmonic_average == false)) &&
            (this->m_use_mapped != true)) {
      MFIter::MFIter((MFIter *)&c_ls,(FabArrayBase *)sol,true);
      while (c_ls.arr[4]._0_4_ < c_ls.arr[5]._0_4_) {
        MFIter::tilebox((Box *)&local_ac0,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&u_ls,(FabArray<amrex::FArrayBox> *)*plVar46,
                   (MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&r_ls,&sol->super_FabArray<amrex::FArrayBox>,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_2c8,(FabArray<amrex::FArrayBox> *)&mfi,
                   (MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&mfi_2,&rhs->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&c_ls);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_9e0,this_00,(MFIter *)&c_ls);
        a_ls.arr[4] = (double)CONCAT44(local_9e0.begin.y,local_9e0.begin.x);
        a_ls.arr._52_8_ = local_9e0._52_8_;
        a_ls.arr[2] = (double)local_9e0.kstride;
        a_ls.arr[3] = (double)local_9e0.nstride;
        a_ls.arr[0] = (double)local_9e0.p;
        a_ls.arr[1] = (double)local_9e0.jstride;
        a_ls.arr._116_8_ = r_ls.arr._52_8_;
        a_ls.arr[0xc] = r_ls.arr[4];
        a_ls.arr[10] = r_ls.arr[2];
        a_ls.arr[0xb] = r_ls.arr[3];
        a_ls.arr[8] = r_ls.arr[0];
        a_ls.arr[9] = r_ls.arr[1];
        a_ls.arr[0x14] = (double)CONCAT44(mfi_2.beginIndex,mfi_2.currentIndex);
        a_ls.arr[0x16]._4_4_ = mfi_2._52_4_;
        a_ls.arr[0x17]._0_4_ = (int)mfi_2.index_map;
        a_ls.arr[0x12] = (double)mfi_2.tile_size.vect._0_8_;
        a_ls.arr[0x13] = (double)mfi_2._24_8_;
        a_ls.arr[0x10] =
             (double)mfi_2.m_fa._M_t.
                     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        a_ls.arr[0x11] = (double)mfi_2.fabArray;
        a_ls.arr[0x1e]._4_4_ = (int)local_2c8._52_8_;
        a_ls.arr[0x1f]._0_4_ = SUB84(local_2c8._52_8_,4);
        a_ls.arr[0x1c]._0_4_ = (int)local_2c8._32_8_;
        a_ls.arr[0x1c]._4_4_ = SUB84(local_2c8._32_8_,4);
        a_ls.arr[0x1a] = (double)local_2c8._16_8_;
        a_ls.arr[0x1b] = (double)local_2c8._24_8_;
        a_ls.arr[0x18]._0_4_ = (int)local_2c8._0_8_;
        a_ls.arr[0x18]._4_4_ = SUB84(local_2c8._0_8_,4);
        a_ls.arr[0x19] = (double)local_2c8._8_8_;
        LoopConcurrent<amrex::mlndlap_jacobi_aa(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                  ((Box *)&local_ac0,(anon_class_328_6_f7bd19c5 *)&a_ls);
        MFIter::operator++((MFIter *)&c_ls);
      }
    }
    else {
      MFIter::MFIter((MFIter *)&c_ls,(FabArrayBase *)sol,true);
      while (c_ls.arr[4]._0_4_ < c_ls.arr[5]._0_4_) {
        MFIter::tilebox((Box *)&local_908,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&u_ls,(FabArray<amrex::FArrayBox> *)*plVar46,
                   (MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&r_ls,(FabArray<amrex::FArrayBox> *)plVar46[1],
                   (MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_2c8,(FabArray<amrex::FArrayBox> *)plVar46[2],
                   (MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&mfi_2,&sol->super_FabArray<amrex::FArrayBox>,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_9e0,(FabArray<amrex::FArrayBox> *)&mfi,(MFIter *)&c_ls);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_ac0,&rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)&c_ls);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_950,this_00,(MFIter *)&c_ls);
        a_ls.arr[4] = (double)CONCAT44(local_950.begin.y,local_950.begin.x);
        a_ls.arr._52_8_ = local_950._52_8_;
        a_ls.arr[2] = (double)local_950.kstride;
        a_ls.arr[3] = (double)local_950.nstride;
        a_ls.arr[0] = (double)local_950.p;
        a_ls.arr[1] = (double)local_950.jstride;
        a_ls.arr[0xc] = (double)CONCAT44(mfi_2.beginIndex,mfi_2.currentIndex);
        a_ls.arr._116_8_ = mfi_2._52_8_;
        a_ls.arr[10] = (double)mfi_2.tile_size.vect._0_8_;
        a_ls.arr[0xb] = (double)mfi_2._24_8_;
        a_ls.arr[8] = (double)mfi_2.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        a_ls.arr[9] = (double)mfi_2.fabArray;
        a_ls.arr[0x14] = (double)CONCAT44(local_ac0.begin.y,local_ac0.begin.x);
        a_ls.arr[0x16]._4_4_ = local_ac0.end.z;
        a_ls.arr[0x17]._0_4_ = local_ac0.ncomp;
        a_ls.arr[0x12] = (double)local_ac0.kstride;
        a_ls.arr[0x13] = (double)local_ac0.nstride;
        a_ls.arr[0x10] = (double)local_ac0.p;
        a_ls.arr[0x11] = (double)local_ac0.jstride;
        a_ls.arr[0x1e]._4_4_ = local_9e0.end.z;
        a_ls.arr[0x1f]._0_4_ = local_9e0.ncomp;
        a_ls.arr[0x1c]._0_4_ = local_9e0.begin.x;
        a_ls.arr[0x1c]._4_4_ = local_9e0.begin.y;
        a_ls.arr[0x1a] = (double)local_9e0.kstride;
        a_ls.arr[0x1b] = (double)local_9e0.nstride;
        a_ls.arr[0x18]._0_4_ = (int)local_9e0.p;
        a_ls.arr[0x18]._4_4_ = (undefined4)((ulong)local_9e0.p >> 0x20);
        a_ls.arr[0x19] = (double)local_9e0.jstride;
        LoopConcurrent<amrex::mlndlap_jacobi_ha(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                  ((Box *)&local_908,(anon_class_472_10_2a1b4a53 *)&a_ls);
        MFIter::operator++((MFIter *)&c_ls);
      }
    }
    MFIter::~MFIter((MFIter *)&c_ls);
    MultiFab::~MultiFab((MultiFab *)&mfi);
    return;
  }
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    MFIter::MFIter(&mfi,(FabArrayBase *)sol,'\0');
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::validbox((Box *)&mfi_2,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&c_ls,&sol->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&u_ls,&rhs->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&r_ls,*(FabArray<amrex::FArrayBox> **)(lVar52 + lVar49 * 8)
                 ,&mfi);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)local_2c8,this_00,&mfi);
      for (iVar44 = 0; iVar44 < (this->super_MLNodeLinOp).m_smooth_num_sweeps; iVar44 = iVar44 + 1)
      {
        a_ls.arr._52_8_ = local_2c8._52_8_;
        a_ls.arr[4] = (double)local_2c8._32_8_;
        a_ls.arr[2] = (double)local_2c8._16_8_;
        a_ls.arr[3] = (double)local_2c8._24_8_;
        a_ls.arr[0] = (double)local_2c8._0_8_;
        a_ls.arr[1] = (double)local_2c8._8_8_;
        a_ls.arr[0xc] = (double)CONCAT44(c_ls.arr[4]._4_4_,c_ls.arr[4]._0_4_);
        a_ls.arr._116_8_ = c_ls.arr._52_8_;
        a_ls.arr[10] = c_ls.arr[2];
        a_ls.arr[0xb] = c_ls.arr[3];
        a_ls.arr[8] = c_ls.arr[0];
        a_ls.arr[9] = c_ls.arr[1];
        a_ls.arr[0x16]._0_4_ = r_ls.arr[6]._0_4_;
        a_ls.arr[0x16]._4_4_ = r_ls.arr[6]._4_4_;
        a_ls.arr[0x17]._0_4_ = r_ls.arr[7]._0_4_;
        a_ls.arr[0x14] = r_ls.arr[4];
        a_ls.arr[0x15]._0_4_ = r_ls.arr[5]._0_4_;
        a_ls.arr[0x15]._4_4_ = r_ls.arr[5]._4_4_;
        a_ls.arr[0x12] = r_ls.arr[2];
        a_ls.arr[0x13] = r_ls.arr[3];
        a_ls.arr[0x10] = r_ls.arr[0];
        a_ls.arr[0x11] = r_ls.arr[1];
        a_ls.arr[0x1e]._0_4_ = u_ls.arr[6]._0_4_;
        a_ls.arr[0x1e]._4_4_ = u_ls.arr[6]._4_4_;
        a_ls.arr[0x1f]._0_4_ = u_ls.arr[7]._0_4_;
        a_ls.arr[0x1c]._0_4_ = SUB84(u_ls.arr[4],0);
        a_ls.arr[0x1c]._4_4_ = (int)((ulong)u_ls.arr[4] >> 0x20);
        a_ls.arr[0x1d]._0_4_ = u_ls.arr[5]._0_4_;
        a_ls.arr[0x1d]._4_4_ = u_ls.arr[5]._4_4_;
        a_ls.arr[0x1a] = u_ls.arr[2];
        a_ls.arr[0x1b] = u_ls.arr[3];
        a_ls.arr[0x18]._0_4_ = SUB84(u_ls.arr[0],0);
        a_ls.arr[0x18]._4_4_ = (undefined4)((ulong)u_ls.arr[0] >> 0x20);
        a_ls.arr[0x19] = u_ls.arr[1];
        LoopConcurrent<amrex::mlndlap_gauss_seidel_sten(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&)::_lambda(int,int,int)_1_>
                  ((Box *)&mfi_2,(anon_class_256_4_a2b17762 *)&a_ls);
      }
      MFIter::operator++(&mfi);
    }
  }
  else if (*plVar46 == 0) {
    RVar1 = this->m_const_sigma;
    MFIter::MFIter(&mfi,(FabArrayBase *)sol,'\0');
    dVar54 = dVar54 * 0.027777777777777776 * dVar54;
    dVar40 = dVar40 * 0.027777777777777776 * dVar40;
    dVar2 = dVar2 * 0.027777777777777776 * dVar2;
    dVar58 = dVar54 + dVar54;
    dVar68 = dVar2 + dVar2;
    dVar31 = (dVar40 * -2.0 + dVar2 * 4.0) - dVar58;
    local_968._8_4_ = SUB84(dVar31,0);
    local_968._0_8_ = (dVar40 * 4.0 + -dVar68) - dVar58;
    local_968._12_4_ = (int)((ulong)dVar31 >> 0x20);
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::validbox((Box *)local_2c8,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&c_ls,&sol->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&u_ls,&rhs->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&r_ls,this_00,&mfi);
      for (iVar44 = 0; iVar44 < (this->super_MLNodeLinOp).m_smooth_num_sweeps; iVar44 = iVar44 + 1)
      {
        a_ls.arr._52_8_ = r_ls.arr._52_8_;
        a_ls.arr[4] = r_ls.arr[4];
        a_ls.arr[2] = r_ls.arr[2];
        a_ls.arr[3] = r_ls.arr[3];
        a_ls.arr[0] = r_ls.arr[0];
        a_ls.arr[1] = r_ls.arr[1];
        a_ls.arr[0xc] = (double)CONCAT44(c_ls.arr[4]._4_4_,c_ls.arr[4]._0_4_);
        a_ls.arr._116_8_ = c_ls.arr._52_8_;
        a_ls.arr[10] = c_ls.arr[2];
        a_ls.arr[0xb] = c_ls.arr[3];
        a_ls.arr[8] = c_ls.arr[0];
        a_ls.arr[9] = c_ls.arr[1];
        a_ls.arr[0x14] = (double)local_968._0_8_;
        a_ls.arr[0x15]._0_4_ = local_968._8_4_;
        a_ls.arr[0x15]._4_4_ = local_968._12_4_;
        a_ls.arr[0x1d]._0_4_ = u_ls.arr[6]._0_4_;
        a_ls.arr[0x1d]._4_4_ = u_ls.arr[6]._4_4_;
        a_ls.arr[0x1e]._0_4_ = u_ls.arr[7]._0_4_;
        a_ls.arr[0x1b] = u_ls.arr[4];
        a_ls.arr[0x1c]._0_4_ = u_ls.arr[5]._0_4_;
        a_ls.arr[0x1c]._4_4_ = u_ls.arr[5]._4_4_;
        a_ls.arr[0x19] = u_ls.arr[2];
        a_ls.arr[0x1a] = u_ls.arr[3];
        a_ls.arr[0x17]._0_4_ = SUB84(u_ls.arr[0],0);
        a_ls.arr[0x17]._4_4_ = (int)((ulong)u_ls.arr[0] >> 0x20);
        a_ls.arr[0x18]._0_4_ = SUB84(u_ls.arr[1],0);
        a_ls.arr[0x18]._4_4_ = (undefined4)((ulong)u_ls.arr[1] >> 0x20);
        a_ls.arr[0x1f]._0_4_ = SUB84(RVar1,0);
        a_ls.arr[0x1f]._4_4_ = (int)((ulong)RVar1 >> 0x20);
        a_ls.arr[0x10] = dVar40 + dVar2 + dVar54;
        a_ls.arr[0x11] = ((dVar2 + dVar2) - dVar40) + dVar58;
        a_ls.arr[0x12] = ((dVar40 + dVar40) - dVar2) + dVar58;
        a_ls.arr[0x13] = (dVar40 + dVar40 + dVar68) - dVar54;
        a_ls.arr[0x16] = dVar54 * 4.0 + (dVar40 * -2.0 - dVar68);
        Loop<amrex::mlndlap_gauss_seidel_c(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,double,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                  ((Box *)local_2c8,(anon_class_256_11_43b85e95 *)&a_ls);
      }
      MFIter::operator++(&mfi);
    }
  }
  else {
    auVar30._8_4_ = SUB84(dVar2,0);
    auVar30._0_8_ = dVar2;
    auVar30._12_4_ = (int)((ulong)dVar2 >> 0x20);
    dStack_b30 = auVar30._8_8_;
    if (((mglev < 1) || (this->m_use_harmonic_average == false)) && (this->m_use_mapped != true)) {
      MFIter::MFIter(&mfi_2,(FabArrayBase *)sol,'\0');
      dVar63 = dVar54 * 0.027777777777777776 * dVar54;
      dVar31 = dVar40 * 0.027777777777777776 * dVar40;
      dVar58 = dVar2 * 0.027777777777777776 * dVar2;
      dVar64 = dVar31 + dVar58 + dVar63;
      dVar68 = dVar63 + dVar63;
      local_7f8 = ((dVar31 + dVar31) - dVar58) + dVar68;
      dStack_7f0 = ((dVar58 + dVar58) - dVar31) + dVar68;
      dVar61 = dVar58 + dVar58;
      dVar66 = (dVar31 + dVar31 + dVar61) - dVar63;
      dVar67 = (dVar31 * 4.0 + -dVar61) - dVar68;
      dVar68 = (dVar31 * -2.0 + dVar58 * 4.0) - dVar68;
      auVar60._8_8_ = -(ulong)(0.0 < dVar2);
      auVar60._0_8_ = -(ulong)(dVar54 < dVar40);
      auVar32._8_4_ = (int)-(ulong)(0.0 < dStack_b30);
      auVar32._0_8_ = -(ulong)(dVar54 < dVar2);
      auVar32._12_4_ = (int)(-(ulong)(0.0 < dStack_b30) >> 0x20);
      local_7e0 = SUB168(auVar60 | auVar32,0);
      local_97c = SUB164(auVar60 | auVar32,0) | 2;
      local_974 = -(uint)(dVar2 < dVar54 || dVar2 < dVar40);
      if ((local_974 & 1) == 0) {
        local_97c = 1;
      }
      local_968._0_8_ = dVar63 * 4.0 + (dVar31 * -2.0 - dVar61);
      local_978 = -(uint)(dVar40 < dVar54 || dVar40 < dVar2);
      if ((local_978 & 1) == 0) {
        local_97c = 0;
      }
      local_988 = dVar64 * -4.0;
      local_808._8_4_ = SUB84(dStack_7f0,0);
      local_808._0_8_ = dStack_7f0;
      local_808._12_4_ = (int)((ulong)dStack_7f0 >> 0x20);
      local_818 = dVar68;
      dStack_810 = dVar68;
      local_1c8 = dStack_7f0;
      dStack_1c0 = local_7f8;
      while (mfi_2.currentIndex < mfi_2.endIndex) {
        MFIter::validbox(&local_834,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_9e0,(FabArray<amrex::FArrayBox> *)*plVar46,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_ac0,&sol->super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_950,&rhs->super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_908,this_00,&mfi_2);
        if (bVar57) {
          for (iVar44 = 0; iVar44 < (this->super_MLNodeLinOp).m_smooth_num_sweeps;
              iVar44 = iVar44 + 1) {
            a_ls.arr[4] = (double)CONCAT44(local_908.begin.y,local_908.begin.x);
            a_ls.arr._52_8_ = local_908._52_8_;
            a_ls.arr[2] = (double)local_908.kstride;
            a_ls.arr[3] = (double)local_908.nstride;
            a_ls.arr[0] = (double)local_908.p;
            a_ls.arr[1] = (double)local_908.jstride;
            a_ls.arr[0xc] = (double)CONCAT44(local_ac0.begin.y,local_ac0.begin.x);
            a_ls.arr._116_8_ = local_ac0._52_8_;
            a_ls.arr[10] = (double)local_ac0.kstride;
            a_ls.arr[0xb] = (double)local_ac0.nstride;
            a_ls.arr[8] = (double)local_ac0.p;
            a_ls.arr[9] = (double)local_ac0.jstride;
            a_ls.arr[0x17]._0_4_ = local_9e0.end.y;
            a_ls.arr[0x17]._4_4_ = local_9e0.end.z;
            a_ls.arr[0x18]._0_4_ = local_9e0.ncomp;
            a_ls.arr[0x15]._0_4_ = local_9e0.begin.x;
            a_ls.arr[0x15]._4_4_ = local_9e0.begin.y;
            a_ls.arr[0x16]._0_4_ = local_9e0.begin.z;
            a_ls.arr[0x16]._4_4_ = local_9e0.end.x;
            a_ls.arr[0x13] = (double)local_9e0.kstride;
            a_ls.arr[0x14] = (double)local_9e0.nstride;
            a_ls.arr[0x11] = (double)local_9e0.p;
            a_ls.arr[0x12] = (double)local_9e0.jstride;
            a_ls.arr[0x19] = local_1c8;
            a_ls.arr[0x1a] = dStack_1c0;
            a_ls.arr[0x1e]._0_4_ = local_968._0_4_;
            a_ls.arr[0x1e]._4_4_ = local_968._4_4_;
            a_ls.arr[0x1f]._0_4_ = (int)local_950.p;
            a_ls.arr[0x1f]._4_4_ = (int)((ulong)local_950.p >> 0x20);
            a_ls.arr[0x10] = dVar64;
            a_ls.arr[0x1b] = dVar66;
            a_ls.arr[0x1c] = dVar67;
            a_ls.arr[0x1d] = dVar68;
            Loop<amrex::mlndlap_gauss_seidel_aa(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                      (&local_834,(anon_class_312_11_b8f6ed96 *)&a_ls);
          }
        }
        else {
          for (iVar44 = 0; iVar33 = local_834.bigend.vect[2], iVar35 = local_834.bigend.vect[1],
              iVar51 = local_834.smallend.vect[0],
              iVar44 < (this->super_MLNodeLinOp).m_smooth_num_sweeps; iVar44 = iVar44 + 1) {
            lVar52 = (long)local_834.smallend.vect[1];
            dVar54 = (double)(long)local_834.smallend.vect[2];
            lVar41 = (long)local_834.bigend.vect[1];
            iVar34 = (local_834.bigend.vect[2] - local_834.smallend.vect[2]) + 1;
            if ((local_7e0 & 1) != 0) {
              iVar34 = 0x21;
            }
            iVar48 = (local_834.bigend.vect[1] - local_834.smallend.vect[1]) + 1;
            if ((local_974 & 1) != 0) {
              iVar48 = iVar34;
            }
            lVar49 = (long)local_834.bigend.vect[0];
            iVar34 = (local_834.bigend.vect[0] - local_834.smallend.vect[0]) + 1;
            if ((local_978 & 1) != 0) {
              iVar34 = iVar48;
            }
            if (0x20 < iVar34) {
              Abort_host(
                        "mlndlap_gauss_seidel_with_line_solve_aa is hard-wired to be no longer than 32"
                        );
            }
            lVar36 = (long)iVar51;
            local_998 = (long)iVar34;
            local_9f0 = dVar54;
            local_9a0 = lVar49;
            if (local_97c == 2) {
              local_a78 = (double *)(ulong)(iVar34 - 2);
              local_a80 = local_2c8 + (ulong)(iVar34 - 1) * 8;
              local_990 = u_ls.arr + (iVar34 - 1);
              while (lVar41 = lVar52, iVar34 = (int)lVar41, iVar34 <= iVar35) {
                local_a70 = (undefined1 *)CONCAT44(local_a70._4_4_,iVar34 + -1);
                lVar43 = lVar36 << 3;
                iVar48 = iVar51;
                while (lVar45 = local_998, dVar54 = local_9f0, lVar52 = lVar41 + 1,
                      iVar48 <= (int)lVar49) {
                  lVar50 = (long)((iVar48 + -1) - local_9e0.begin.x);
                  lVar37 = ((int)local_a70 - local_9e0.begin.y) * local_9e0.jstride;
                  local_9f8 = local_9e0.p + lVar37 + (iVar48 - local_9e0.begin.x);
                  lVar52 = (iVar34 - local_9e0.begin.y) * local_9e0.jstride;
                  local_a00 = local_9e0.p + lVar52 + lVar50;
                  local_a08 = local_9e0.p + lVar52 + (iVar48 - local_9e0.begin.x);
                  lVar52 = (long)((iVar48 + -1) - local_ac0.begin.x);
                  local_a68 = (double *)CONCAT44(local_a68._4_4_,iVar48 + 1);
                  lVar49 = ((int)local_a70 - local_ac0.begin.y) * local_ac0.jstride;
                  lVar47 = ((int)(lVar41 + 1) - local_ac0.begin.y) * local_ac0.jstride;
                  lVar53 = (iVar34 - local_ac0.begin.y) * local_ac0.jstride;
                  local_a10 = local_ac0.p + lVar49 + lVar52;
                  lVar55 = (long)((iVar48 + 1) - local_ac0.begin.x);
                  local_a18 = local_ac0.p + lVar49 + lVar55;
                  local_a40 = local_ac0.p + lVar49 + (iVar48 - local_ac0.begin.x);
                  local_a50 = local_ac0.p + lVar47 + (iVar48 - local_ac0.begin.x);
                  local_a20 = local_950.p +
                              ((long)iVar34 - (long)local_950.begin.y) * local_950.jstride +
                              ((long)iVar48 - (long)local_950.begin.x);
                  local_a28 = (long)local_908.begin.z;
                  local_a38 = (double *)(long)local_9e0.begin.z;
                  local_a48 = (double)local_9e0.kstride;
                  local_a58 = (double)(long)local_950.begin.z;
                  local_a60 = (double)local_950.kstride;
                  local_a30 = (double)local_908.kstride;
                  dVar40 = local_9f0;
                  while ((long)dVar40 <= (long)iVar33) {
                    if (local_908.p
                        [((long)iVar34 - (long)local_908.begin.y) * local_908.jstride +
                         ((long)iVar48 - (long)local_908.begin.x) +
                         ((long)dVar40 - local_a28) * local_908.kstride] == 0) {
                      lVar49 = (((long)dVar40 + -1) - (long)local_a38) * local_9e0.kstride;
                      dVar2 = local_9e0.p[lVar37 + lVar50 + lVar49];
                      dVar31 = local_9f8[lVar49];
                      dVar65 = dVar2 + dVar31;
                      dVar58 = local_a00[lVar49];
                      dVar61 = local_a08[lVar49];
                      dVar59 = dVar65 + dVar58 + dVar61;
                      lVar49 = ((long)dVar40 - (long)local_a38) * local_9e0.kstride;
                      dVar63 = local_9e0.p[lVar37 + lVar50 + lVar49];
                      dVar3 = local_9f8[lVar49];
                      dVar4 = local_a00[lVar49];
                      dVar5 = local_a08[lVar49];
                      lVar49 = (((long)dVar40 + -1) - (long)local_ac0.begin.z) * local_ac0.kstride;
                      dVar6 = local_a18[lVar49];
                      dVar7 = local_a10[lVar49];
                      dVar8 = local_ac0.p[lVar47 + lVar52 + lVar49];
                      dVar9 = local_ac0.p[lVar47 + lVar55 + lVar49];
                      lVar56 = ((int)((long)dVar40 + 1) - local_ac0.begin.z) * local_ac0.kstride;
                      dVar10 = local_a10[lVar56];
                      dVar11 = local_a18[lVar56];
                      dVar12 = local_ac0.p[lVar47 + lVar52 + lVar56];
                      dVar13 = local_ac0.p[lVar47 + lVar55 + lVar56];
                      dVar14 = local_a50[lVar49];
                      dVar15 = local_a40[lVar49];
                      dVar16 = local_a40[lVar56];
                      dVar17 = local_ac0.p[lVar53 + lVar52 + lVar49];
                      dVar18 = local_a50[lVar56];
                      dVar19 = local_ac0.p[lVar53 + lVar55 + lVar49];
                      dVar20 = local_ac0.p[lVar53 + lVar52 + lVar56];
                      dVar21 = local_ac0.p[lVar53 + lVar55 + lVar56];
                      lVar49 = ((long)dVar40 - (long)local_ac0.begin.z) * local_ac0.kstride;
                      dVar22 = local_a18[lVar49];
                      dVar23 = local_a10[lVar49];
                      dVar24 = local_ac0.p[lVar47 + lVar52 + lVar49];
                      dVar25 = local_ac0.p[lVar47 + lVar55 + lVar49];
                      dVar26 = local_ac0.p[lVar53 + lVar55 + lVar49];
                      dVar27 = local_ac0.p[lVar53 + lVar52 + lVar49];
                      dVar28 = local_a50[lVar49];
                      dVar62 = local_a40[lVar49];
                      lVar49 = (long)dVar40 - (long)local_9f0;
                      *(double *)((long)&a_ls + lVar49 * 8) = dVar59 * (double)local_968._0_8_;
                      *(double *)((long)&mfi + lVar49 * 8) =
                           (dVar59 + dVar63 + dVar3 + dVar4 + dVar5) * local_988;
                      *(undefined8 *)((long)&u_ls + lVar49 * 8) = 0;
                      *(double *)((long)&c_ls + lVar49 * 8) =
                           (dVar63 + dVar3 + dVar4 + dVar5) * (double)local_968._0_8_;
                      *(double *)((long)&r_ls + lVar49 * 8) =
                           local_a20[((long)dVar40 - (long)local_a58) * local_950.kstride] -
                           (((dVar65 + dVar63 + dVar3) * dVar62 +
                            (dVar58 + dVar61 + dVar4 + dVar5) * dVar28) * local_818 +
                           ((dVar2 + dVar58 + dVar63 + dVar4) * dVar27 +
                           (dVar31 + dVar61 + dVar3 + dVar5) * dVar26) * dVar67 +
                           ((dVar61 + dVar5) * dVar25 +
                           (dVar58 + dVar4) * dVar24 +
                           (dVar2 + dVar63) * dVar23 + (dVar31 + dVar3) * dVar22) * dVar66 +
                           ((dVar3 + dVar5) * dVar21 +
                           (dVar63 + dVar4) * dVar20 +
                           dVar17 * (dVar2 + dVar58) + dVar19 * (dVar31 + dVar61)) * local_7f8 +
                           (dVar13 * dVar5 +
                           dVar12 * dVar4 +
                           dVar11 * dVar3 +
                           dVar10 * dVar63 +
                           dVar9 * dVar61 + dVar8 * dVar58 + dVar7 * dVar2 + dVar6 * dVar31) *
                           dVar64 + ((dVar4 + dVar5) * dVar18 +
                                    dVar16 * (dVar63 + dVar3) +
                                    dVar15 * dVar65 + dVar14 * (dVar58 + dVar61)) *
                                    (double)local_808._0_8_);
                      dVar40 = (double)((long)dVar40 + 1);
                    }
                    else {
                      lVar49 = (long)dVar40 - (long)local_9f0;
                      *(undefined8 *)((long)&a_ls + lVar49 * 8) = 0;
                      *(undefined8 *)((long)&c_ls + lVar49 * 8) = 0;
                      *(undefined8 *)((long)&mfi + lVar49 * 8) = 0x3ff0000000000000;
                      *(undefined8 *)((long)&u_ls + lVar49 * 8) = 0;
                      *(undefined8 *)((long)&r_ls + lVar49 * 8) = 0;
                      dVar40 = (double)((long)dVar40 + 1);
                    }
                  }
                  local_b60._M_t.
                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                       (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                       (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                       mfi.m_fa._M_t.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
                  dVar40 = r_ls.arr[0] /
                           (double)mfi.m_fa._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                  ;
                  u_ls.arr[0] = dVar40;
                  for (lVar52 = 1; lVar52 < lVar45; lVar52 = lVar52 + 1) {
                    dVar31 = c_ls.arr[lVar52 + -1] /
                             (double)local_b60._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl;
                    *(double *)(local_2c8 + lVar52 * 8) = dVar31;
                    dVar2 = a_ls.arr[lVar52];
                    local_b60._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                         (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                         (*(double *)(mfi.tile_size.vect + lVar52 * 2 + -4) - dVar31 * dVar2);
                    if (((double)local_b60._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                         == 0.0) &&
                       (!NAN((double)local_b60._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl))) {
                      Abort_host(">>>TRIDIAG FAILED");
                    }
                    dVar40 = (dVar40 * -dVar2 + r_ls.arr[lVar52]) /
                             (double)local_b60._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl;
                    u_ls.arr[lVar52] = dVar40;
                  }
                  for (lVar52 = 0; -1 < (int)((long)local_a78 + lVar52); lVar52 = lVar52 + -1) {
                    uVar38 = (long)local_a78 + lVar52 & 0xffffffff;
                    u_ls.arr[uVar38] =
                         u_ls.arr[uVar38] - *(double *)(local_a80 + lVar52 * 8) * local_990[lVar52];
                  }
                  puVar39 = (undefined8 *)
                            (((long)dVar54 - (long)local_ac0.begin.z) * local_ac0.kstride * 8 +
                             lVar43 + (lVar41 - local_ac0.begin.y) * local_ac0.jstride * 8 +
                             (long)local_ac0.begin.x * -8 + (long)local_ac0.p);
                  pdVar42 = u_ls.arr;
                  for (; (long)dVar54 <= (long)iVar33; dVar54 = (double)((long)dVar54 + 1)) {
                    *puVar39 = *pdVar42;
                    puVar39 = puVar39 + local_ac0.kstride;
                    pdVar42 = pdVar42 + 1;
                  }
                  lVar43 = lVar43 + 8;
                  lVar49 = local_9a0;
                  iVar48 = (int)local_a68;
                }
              }
            }
            else if (local_97c == 1) {
              local_7c8 = (ulong)(iVar34 - 2);
              local_7d0 = local_2c8 + (ulong)(iVar34 - 1) * 8;
              local_7d8 = u_ls.arr + (iVar34 - 1);
              while (SUB84(dVar54,0) <= iVar33) {
                local_970 = SUB84(dVar54,0) + -1;
                local_910 = (double)((long)dVar54 + 1);
                lVar43 = lVar36 << 3;
                dVar40 = dVar54;
                iVar35 = iVar51;
                local_9f0 = dVar54;
                while (lVar45 = local_998, dVar2 = local_9f0, dVar54 = local_910,
                      iVar35 <= (int)lVar49) {
                  iVar34 = SUB84(dVar40,0);
                  local_a30 = (double)((local_970 - local_9e0.begin.z) * local_9e0.kstride);
                  local_a40 = (double *)((iVar34 - local_9e0.begin.z) * local_9e0.kstride);
                  local_96c = iVar35 + 1;
                  local_990 = (double *)((local_970 - local_ac0.begin.z) * local_ac0.kstride);
                  local_7b0 = (SUB84(local_910,0) - local_ac0.begin.z) * local_ac0.kstride;
                  lVar50 = (iVar34 - local_ac0.begin.z) * local_ac0.kstride;
                  local_a10 = (double *)(long)local_908.begin.y;
                  local_a08 = local_950.p +
                              ((long)iVar35 - (long)local_950.begin.x) +
                              ((long)iVar34 - (long)local_950.begin.z) * local_950.kstride;
                  local_a18 = (double *)(long)((iVar35 + -1) - local_9e0.begin.x);
                  local_a20 = (double *)(long)(iVar35 - local_9e0.begin.x);
                  local_a28 = (long)((iVar35 + -1) - local_ac0.begin.x);
                  local_a38 = (double *)(long)(local_96c - local_ac0.begin.x);
                  local_a48 = (double)(long)(iVar35 - local_ac0.begin.x);
                  local_a50 = local_9e0.p;
                  local_a58 = (double)local_9e0.jstride;
                  local_a60 = (double)(long)local_9e0.begin.y;
                  local_a68 = local_ac0.p;
                  local_a70 = (undefined1 *)(long)local_ac0.begin.y;
                  local_a78 = (double *)(long)local_950.begin.y;
                  local_a80 = (undefined1 *)local_950.jstride;
                  local_7b8 = (double)local_908.jstride;
                  lVar49 = lVar52;
                  while (lVar49 <= lVar41) {
                    if (local_908.p
                        [((long)iVar35 - (long)local_908.begin.x) +
                         ((long)iVar34 - (long)local_908.begin.z) * local_908.kstride +
                         (lVar49 - (long)local_a10) * local_908.jstride] == 0) {
                      lVar37 = ((lVar49 + -1) - (long)local_a60) * local_9e0.jstride;
                      dVar54 = local_9e0.p[(long)local_a18 + lVar37 + (long)local_a30];
                      dVar40 = local_9e0.p[(long)local_a20 + lVar37 + (long)local_a30];
                      dVar28 = dVar54 + dVar40;
                      lVar53 = (lVar49 - (long)local_a60) * local_9e0.jstride;
                      dVar31 = local_9e0.p[(long)local_a18 + lVar53 + (long)local_a30];
                      dVar58 = local_9e0.p[(long)local_a20 + lVar53 + (long)local_a30];
                      dVar62 = dVar28 + dVar31 + dVar58;
                      dVar61 = local_9e0.p
                               [(long)(lVar37 + (long)((long)local_a18 + (long)local_a40))];
                      dVar63 = local_9e0.p
                               [(long)(lVar37 + (long)((long)local_a20 + (long)local_a40))];
                      dVar3 = local_9e0.p
                              [(long)(lVar53 + (long)((long)local_a18 + (long)local_a40))];
                      local_9f8 = (double *)
                                  local_9e0.p
                                  [(long)(lVar53 + (long)((long)local_a20 + (long)local_a40))];
                      lVar53 = ((lVar49 + -1) - (long)local_a70) * local_ac0.jstride;
                      dVar4 = local_ac0.p[(long)local_a38 + (long)(lVar53 + (long)local_990)];
                      dVar5 = local_ac0.p[(long)local_990 + lVar53 + local_a28];
                      lVar37 = ((int)(lVar49 + 1) - local_ac0.begin.y) * local_ac0.jstride;
                      dVar6 = local_ac0.p[(long)local_990 + lVar37 + local_a28];
                      dVar7 = local_ac0.p[(long)local_a38 + (long)(lVar37 + (long)local_990)];
                      dVar8 = local_ac0.p[lVar53 + local_a28 + local_7b0];
                      dVar9 = local_ac0.p[(long)local_a38 + lVar53 + local_7b0];
                      dVar10 = local_ac0.p[lVar37 + local_a28 + local_7b0];
                      dVar11 = local_ac0.p[(long)local_a38 + lVar37 + local_7b0];
                      dVar12 = local_ac0.p[(long)local_990 + lVar37 + (long)local_a48];
                      dVar13 = local_ac0.p[(long)local_990 + lVar53 + (long)local_a48];
                      dVar14 = local_ac0.p[lVar53 + (long)local_a48 + local_7b0];
                      lVar47 = (lVar49 - (long)local_a70) * local_ac0.jstride;
                      dVar15 = local_ac0.p[(long)local_990 + lVar47 + local_a28];
                      local_a00 = (double *)(dVar28 + dVar61);
                      dVar16 = local_ac0.p[lVar37 + (long)local_a48 + local_7b0];
                      dVar17 = local_ac0.p[(long)local_a38 + (long)(lVar47 + (long)local_990)];
                      dVar18 = local_ac0.p[lVar47 + local_a28 + local_7b0];
                      dVar19 = local_ac0.p[(long)local_a38 + lVar47 + local_7b0];
                      dVar20 = local_ac0.p[(long)local_a38 + lVar53 + lVar50];
                      dVar21 = local_ac0.p[lVar53 + local_a28 + lVar50];
                      dVar22 = local_ac0.p[lVar37 + local_a28 + lVar50];
                      dVar23 = local_ac0.p[(long)local_a38 + lVar37 + lVar50];
                      dVar24 = local_ac0.p[(long)local_a38 + lVar47 + lVar50];
                      dVar25 = local_ac0.p[lVar47 + local_a28 + lVar50];
                      dVar26 = local_ac0.p[lVar47 + (long)local_a48 + local_7b0];
                      dVar27 = local_ac0.p[(long)local_990 + lVar47 + (long)local_a48];
                      lVar53 = lVar49 - lVar52;
                      *(double *)((long)&a_ls + lVar53 * 8) =
                           ((double)local_a00 + dVar63) * local_818;
                      *(double *)((long)&mfi + lVar53 * 8) =
                           (dVar62 + dVar61 + dVar63 + dVar3 + (double)local_9f8) * local_988;
                      *(undefined8 *)((long)&u_ls + lVar53 * 8) = 0;
                      *(double *)((long)&c_ls + lVar53 * 8) =
                           (dVar31 + dVar58 + dVar3 + (double)local_9f8) * local_818;
                      *(double *)((long)&r_ls + lVar53 * 8) =
                           local_a08[(lVar49 - (long)local_a78) * local_950.jstride] -
                           ((dVar62 * dVar27 +
                            (dVar61 + dVar63 + dVar3 + (double)local_9f8) * dVar26) *
                            (double)local_968._0_8_ +
                           ((dVar54 + dVar31 + dVar61 + dVar3) * dVar25 +
                           (dVar40 + dVar58 + dVar63 + (double)local_9f8) * dVar24) * dVar67 +
                           ((dVar58 + (double)local_9f8) * dVar23 +
                           (dVar31 + dVar3) * dVar22 +
                           (dVar54 + dVar61) * dVar21 + (dVar40 + dVar63) * dVar20) * dVar66 +
                           ((dVar63 + (double)local_9f8) * dVar19 +
                           (dVar61 + dVar3) * dVar18 +
                           dVar15 * (dVar54 + dVar31) + dVar17 * (dVar40 + dVar58)) * local_7f8 +
                           (dVar11 * (double)local_9f8 +
                           dVar10 * dVar3 +
                           dVar9 * dVar63 +
                           dVar8 * dVar61 +
                           dVar7 * dVar58 + dVar6 * dVar31 + dVar5 * dVar54 + dVar4 * dVar40) *
                           dVar64 + ((dVar3 + (double)local_9f8) * dVar16 +
                                    dVar14 * (dVar61 + dVar63) +
                                    dVar13 * dVar28 + dVar12 * (dVar31 + dVar58)) *
                                    (double)local_808._0_8_);
                      lVar49 = lVar49 + 1;
                    }
                    else {
                      lVar53 = lVar49 - lVar52;
                      *(undefined8 *)((long)&a_ls + lVar53 * 8) = 0;
                      *(undefined8 *)((long)&c_ls + lVar53 * 8) = 0;
                      *(undefined8 *)((long)&mfi + lVar53 * 8) = 0x3ff0000000000000;
                      *(undefined8 *)((long)&u_ls + lVar53 * 8) = 0;
                      *(undefined8 *)((long)&r_ls + lVar53 * 8) = 0;
                      lVar49 = lVar49 + 1;
                    }
                  }
                  local_b60._M_t.
                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                       (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                       (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                       mfi.m_fa._M_t.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
                  dVar54 = r_ls.arr[0] /
                           (double)mfi.m_fa._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                  ;
                  u_ls.arr[0] = dVar54;
                  local_7c0 = lVar43;
                  for (lVar49 = 1; lVar49 < lVar45; lVar49 = lVar49 + 1) {
                    dVar31 = c_ls.arr[lVar49 + -1] /
                             (double)local_b60._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl;
                    *(double *)(local_2c8 + lVar49 * 8) = dVar31;
                    dVar40 = a_ls.arr[lVar49];
                    local_b60._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                         (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                         (*(double *)(mfi.tile_size.vect + lVar49 * 2 + -4) - dVar31 * dVar40);
                    if (((double)local_b60._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                         == 0.0) &&
                       (!NAN((double)local_b60._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl))) {
                      Abort_host(">>>TRIDIAG FAILED");
                    }
                    dVar54 = (dVar54 * -dVar40 + r_ls.arr[lVar49]) /
                             (double)local_b60._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl;
                    u_ls.arr[lVar49] = dVar54;
                  }
                  for (lVar49 = 0; -1 < (int)(local_7c8 + lVar49); lVar49 = lVar49 + -1) {
                    uVar38 = local_7c8 + lVar49 & 0xffffffff;
                    u_ls.arr[uVar38] =
                         u_ls.arr[uVar38] - *(double *)(local_7d0 + lVar49 * 8) * local_7d8[lVar49];
                  }
                  puVar39 = (undefined8 *)
                            ((lVar52 - local_ac0.begin.y) * local_ac0.jstride * 8 +
                             local_7c0 +
                             ((long)dVar2 - (long)local_ac0.begin.z) * local_ac0.kstride * 8 +
                             (long)local_ac0.begin.x * -8 + (long)local_ac0.p);
                  pdVar42 = u_ls.arr;
                  for (lVar49 = lVar52; lVar49 <= lVar41; lVar49 = lVar49 + 1) {
                    *puVar39 = *pdVar42;
                    puVar39 = puVar39 + local_ac0.jstride;
                    pdVar42 = pdVar42 + 1;
                  }
                  lVar43 = local_7c0 + 8;
                  lVar49 = local_9a0;
                  dVar40 = dVar2;
                  iVar35 = local_96c;
                }
              }
            }
            else if (local_97c == 0) {
              local_a70 = local_2c8 + (ulong)(iVar34 - 1) * 8;
              local_a78 = u_ls.arr + (iVar34 - 1);
              local_a80 = (undefined1 *)(lVar36 * 8);
              while (lVar41 = lVar52, iVar51 = (int)lVar41, iVar51 <= iVar35) {
                local_a68 = (double *)CONCAT44(local_a68._4_4_,iVar51 + -1);
                dVar40 = dVar54;
                while (lVar43 = local_998, iVar48 = SUB84(dVar40,0), lVar52 = lVar41 + 1,
                      iVar48 <= iVar33) {
                  local_9f8 = (double *)(((iVar48 + -1) - local_9e0.begin.z) * local_9e0.kstride);
                  local_a00 = local_9e0.p + ((int)local_a68 - local_9e0.begin.y) * local_9e0.jstride
                  ;
                  local_a08 = local_9e0.p + (iVar51 - local_9e0.begin.y) * local_9e0.jstride;
                  local_a28 = (iVar48 - local_9e0.begin.z) * local_9e0.kstride;
                  local_a10 = local_ac0.p + ((int)local_a68 - local_ac0.begin.y) * local_ac0.jstride
                  ;
                  local_a18 = local_ac0.p +
                              ((int)(lVar41 + 1) - local_ac0.begin.y) * local_ac0.jstride;
                  local_a60 = (double)((long)dVar40 + 1);
                  local_a20 = local_ac0.p + (iVar51 - local_ac0.begin.y) * local_ac0.jstride;
                  lVar45 = ((iVar48 + -1) - local_ac0.begin.z) * local_ac0.kstride;
                  lVar50 = (SUB84(local_a60,0) - local_ac0.begin.z) * local_ac0.kstride;
                  lVar53 = (iVar48 - local_ac0.begin.z) * local_ac0.kstride;
                  local_a30 = (double)(long)local_908.begin.x;
                  local_a38 = local_950.p +
                              ((long)iVar51 - (long)local_950.begin.y) * local_950.jstride +
                              ((long)iVar48 - (long)local_950.begin.z) * local_950.kstride;
                  local_a40 = (double *)(long)local_9e0.begin.x;
                  local_a48 = (double)(long)local_ac0.begin.x;
                  local_a50 = (double *)(long)local_950.begin.x;
                  lVar52 = lVar36;
                  while (lVar52 <= lVar49) {
                    if (local_908.p
                        [((long)iVar51 - (long)local_908.begin.y) * local_908.jstride +
                         ((long)iVar48 - (long)local_908.begin.z) * local_908.kstride +
                         (lVar52 - (long)local_a30)] == 0) {
                      lVar49 = (lVar52 + -1) - (long)local_a40;
                      dVar54 = local_a00[lVar49 + (long)local_9f8];
                      lVar37 = lVar52 - (long)local_a40;
                      dVar2 = local_a00[lVar37 + (long)local_9f8];
                      dVar62 = dVar54 + dVar2;
                      dVar31 = local_a08[lVar49 + (long)local_9f8];
                      dVar58 = local_a08[lVar37 + (long)local_9f8];
                      dVar65 = dVar62 + dVar31 + dVar58;
                      dVar61 = local_a00[lVar49 + local_a28];
                      dVar63 = local_a00[lVar37 + local_a28];
                      dVar3 = local_a08[lVar49 + local_a28];
                      dVar4 = local_a08[lVar37 + local_a28];
                      lVar49 = (lVar52 + -1) - (long)local_a48;
                      lVar37 = (long)((int)(lVar52 + 1) - local_ac0.begin.x);
                      dVar5 = local_a10[lVar37 + lVar45];
                      dVar6 = local_a10[lVar49 + lVar45];
                      dVar7 = local_a18[lVar49 + lVar45];
                      dVar8 = local_a18[lVar37 + lVar45];
                      dVar9 = local_a10[lVar49 + lVar50];
                      dVar10 = local_a10[lVar37 + lVar50];
                      dVar11 = local_a18[lVar49 + lVar50];
                      dVar12 = local_a18[lVar37 + lVar50];
                      lVar47 = lVar52 - (long)local_a48;
                      dVar13 = local_a18[lVar47 + lVar45];
                      dVar14 = local_a10[lVar47 + lVar45];
                      dVar15 = local_a10[lVar47 + lVar50];
                      dVar16 = local_a20[lVar49 + lVar45];
                      dVar17 = local_a18[lVar47 + lVar50];
                      dVar18 = local_a20[lVar37 + lVar45];
                      dVar19 = local_a20[lVar49 + lVar50];
                      dVar20 = local_a20[lVar37 + lVar50];
                      dVar21 = local_a10[lVar37 + lVar53];
                      dVar22 = local_a10[lVar49 + lVar53];
                      dVar23 = local_a18[lVar49 + lVar53];
                      dVar24 = local_a18[lVar37 + lVar53];
                      dVar25 = local_a18[lVar47 + lVar53];
                      dVar26 = local_a10[lVar47 + lVar53];
                      dVar27 = local_a20[lVar47 + lVar50];
                      dVar28 = local_a20[lVar47 + lVar45];
                      lVar49 = lVar52 - lVar36;
                      *(double *)((long)&a_ls + lVar49 * 8) =
                           (dVar54 + dVar31 + dVar61 + dVar3) * dVar67;
                      *(double *)((long)&mfi + lVar49 * 8) =
                           (dVar65 + dVar61 + dVar63 + dVar3 + dVar4) * local_988;
                      *(double *)((long)&c_ls + lVar49 * 8) =
                           (dVar2 + dVar58 + dVar63 + dVar4) * dVar67;
                      *(undefined8 *)((long)&u_ls + lVar49 * 8) = 0;
                      *(double *)((long)&r_ls + lVar49 * 8) =
                           local_a38[lVar52 - (long)local_a50] -
                           ((dVar65 * dVar28 + (dVar61 + dVar63 + dVar3 + dVar4) * dVar27) *
                            (double)local_968._0_8_ +
                           ((dVar62 + dVar61 + dVar63) * dVar26 +
                           (dVar31 + dVar58 + dVar3 + dVar4) * dVar25) * local_818 +
                           ((dVar58 + dVar4) * dVar24 +
                           (dVar31 + dVar3) * dVar23 +
                           (dVar54 + dVar61) * dVar22 + (dVar2 + dVar63) * dVar21) * dVar66 +
                           ((dVar63 + dVar4) * dVar20 +
                           (dVar61 + dVar3) * dVar19 +
                           dVar16 * (dVar54 + dVar31) + dVar18 * (dVar2 + dVar58)) * local_7f8 +
                           (dVar12 * dVar4 +
                           dVar11 * dVar3 +
                           dVar10 * dVar63 +
                           dVar9 * dVar61 +
                           dVar8 * dVar58 + dVar7 * dVar31 + dVar6 * dVar54 + dVar5 * dVar2) *
                           dVar64 + ((dVar3 + dVar4) * dVar17 +
                                    dVar15 * (dVar61 + dVar63) +
                                    dVar14 * dVar62 + dVar13 * (dVar31 + dVar58)) *
                                    (double)local_808._0_8_);
                      lVar52 = lVar52 + 1;
                      lVar49 = local_9a0;
                      dVar54 = local_9f0;
                    }
                    else {
                      lVar37 = lVar52 - lVar36;
                      *(undefined8 *)((long)&a_ls + lVar37 * 8) = 0;
                      *(undefined8 *)((long)&c_ls + lVar37 * 8) = 0;
                      *(undefined8 *)((long)&mfi + lVar37 * 8) = 0x3ff0000000000000;
                      *(undefined8 *)((long)&u_ls + lVar37 * 8) = 0;
                      *(undefined8 *)((long)&r_ls + lVar37 * 8) = 0;
                      lVar52 = lVar52 + 1;
                    }
                  }
                  local_b60._M_t.
                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                       (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                       (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                       mfi.m_fa._M_t.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
                  dVar2 = r_ls.arr[0] /
                          (double)mfi.m_fa._M_t.
                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
                  u_ls.arr[0] = dVar2;
                  local_a58 = dVar40;
                  for (lVar52 = 1; lVar52 < lVar43; lVar52 = lVar52 + 1) {
                    dVar31 = c_ls.arr[lVar52 + -1] /
                             (double)local_b60._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl;
                    *(double *)(local_2c8 + lVar52 * 8) = dVar31;
                    dVar40 = a_ls.arr[lVar52];
                    local_b60._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                         (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                         (*(double *)(mfi.tile_size.vect + lVar52 * 2 + -4) - dVar31 * dVar40);
                    if (((double)local_b60._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                         == 0.0) &&
                       (!NAN((double)local_b60._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl))) {
                      Abort_host(">>>TRIDIAG FAILED");
                    }
                    dVar2 = (dVar2 * -dVar40 + r_ls.arr[lVar52]) /
                            (double)local_b60._M_t.
                                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                    _M_head_impl;
                    u_ls.arr[lVar52] = dVar2;
                  }
                  for (lVar52 = 0; uVar38 = (ulong)(iVar34 - 2) + lVar52, -1 < (int)uVar38;
                      lVar52 = lVar52 + -1) {
                    uVar38 = uVar38 & 0xffffffff;
                    u_ls.arr[uVar38] =
                         u_ls.arr[uVar38] - *(double *)(local_a70 + lVar52 * 8) * local_a78[lVar52];
                  }
                  for (lVar52 = 0; dVar40 = local_a60, lVar49 = local_9a0,
                      lVar36 + lVar52 <= local_9a0; lVar52 = lVar52 + 1) {
                    *(double *)
                     ((long)local_ac0.p +
                     (long)(local_a80 +
                           lVar52 * 8 +
                           ((long)local_a58 - (long)local_ac0.begin.z) * local_ac0.kstride * 8 +
                           (lVar41 - local_ac0.begin.y) * local_ac0.jstride * 8 +
                           (long)local_ac0.begin.x * -8)) = u_ls.arr[lVar52];
                  }
                }
              }
            }
            else {
              Abort_host("mlndlap_gauss_seidel_with_line_solve_aa is wrong direction.");
            }
          }
        }
        MFIter::operator++(&mfi_2);
      }
      this_01 = &mfi_2;
      goto LAB_00651f63;
    }
    MFIter::MFIter(&mfi,(FabArrayBase *)sol,'\0');
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::validbox((Box *)&local_ac0,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&c_ls,(FabArray<amrex::FArrayBox> *)*plVar46,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&u_ls,(FabArray<amrex::FArrayBox> *)plVar46[1],&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&r_ls,(FabArray<amrex::FArrayBox> *)plVar46[2],&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_2c8,&sol->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&mfi_2,&rhs->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&local_9e0,this_00,&mfi);
      for (iVar44 = 0; iVar44 < (this->super_MLNodeLinOp).m_smooth_num_sweeps; iVar44 = iVar44 + 1)
      {
        a_ls.arr[4] = (double)CONCAT44(local_9e0.begin.y,local_9e0.begin.x);
        a_ls.arr._52_8_ = local_9e0._52_8_;
        a_ls.arr[2] = (double)local_9e0.kstride;
        a_ls.arr[3] = (double)local_9e0.nstride;
        a_ls.arr[0] = (double)local_9e0.p;
        a_ls.arr[1] = (double)local_9e0.jstride;
        a_ls.arr._116_8_ = local_2c8._52_8_;
        a_ls.arr[0xc] = (double)local_2c8._32_8_;
        a_ls.arr[10] = (double)local_2c8._16_8_;
        a_ls.arr[0xb] = (double)local_2c8._24_8_;
        a_ls.arr[8] = (double)local_2c8._0_8_;
        a_ls.arr[9] = (double)local_2c8._8_8_;
        a_ls.arr[0x17]._0_4_ = c_ls.arr[6]._0_4_;
        a_ls.arr[0x17]._4_4_ = c_ls.arr[6]._4_4_;
        a_ls.arr[0x18]._0_4_ = c_ls.arr[7]._0_4_;
        a_ls.arr[0x15]._0_4_ = c_ls.arr[4]._0_4_;
        a_ls.arr[0x15]._4_4_ = c_ls.arr[4]._4_4_;
        a_ls.arr[0x16]._0_4_ = c_ls.arr[5]._0_4_;
        a_ls.arr[0x16]._4_4_ = c_ls.arr[5]._4_4_;
        a_ls.arr[0x13] = c_ls.arr[2];
        a_ls.arr[0x14] = c_ls.arr[3];
        a_ls.arr[0x11] = c_ls.arr[0];
        a_ls.arr[0x12] = c_ls.arr[1];
        a_ls.arr[0x1e]._0_4_ = SUB84(u_ls.arr[4],0);
        a_ls.arr[0x1e]._4_4_ = (int)((ulong)u_ls.arr[4] >> 0x20);
        a_ls.arr[0x1f]._0_4_ = u_ls.arr[5]._0_4_;
        a_ls.arr[0x1f]._4_4_ = u_ls.arr[5]._4_4_;
        a_ls.arr[0x1c]._0_4_ = SUB84(u_ls.arr[2],0);
        a_ls.arr[0x1c]._4_4_ = (int)((ulong)u_ls.arr[2] >> 0x20);
        a_ls.arr[0x1d]._0_4_ = SUB84(u_ls.arr[3],0);
        a_ls.arr[0x1d]._4_4_ = (int)((ulong)u_ls.arr[3] >> 0x20);
        a_ls.arr[0x1a] = u_ls.arr[0];
        a_ls.arr[0x1b] = u_ls.arr[1];
        a_ls.arr[0x10] = dVar40 * 0.027777777777777776 * dVar40;
        a_ls.arr[0x19] = dVar2 * 0.027777777777777776 * dVar2;
        Loop<amrex::mlndlap_gauss_seidel_ha(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                  ((Box *)&local_ac0,(anon_class_408_9_11dfeee2 *)&a_ls);
      }
      MFIter::operator++(&mfi);
    }
  }
  this_01 = &mfi;
LAB_00651f63:
  MFIter::~MFIter(this_01);
  MLNodeLinOp::nodalSync(&this->super_MLNodeLinOp,local_9e4,mglev,sol);
  return;
}

Assistant:

void
MLNodeLaplacian::Fsmooth (int amrlev, int mglev, MultiFab& sol, const MultiFab& rhs) const
{
    BL_PROFILE("MLNodeLaplacian::Fsmooth()");

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        auto solarr_ma = sol.arrays();
        auto rhsarr_ma = rhs.const_arrays();
        auto dmskarr_ma = dmsk.const_arrays();
        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            auto starr_ma = stencil->const_arrays();
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_sten(i,j,k,solarr_ma[box_no],starr_ma[box_no],dmskarr_ma[box_no]);
                    mlndlap_jacobi_sten(i,j,k,solarr_ma[box_no],Ax,rhsarr_ma[box_no],starr_ma[box_no],dmskarr_ma[box_no]);
                });
            }
        }
        else if (sigma[0] == nullptr)
        {
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                Real const_sigma = m_const_sigma;
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_c(i,j,k,solarr_ma[box_no],const_sigma,dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                              is_rz,
#endif
                                              dxinvarr);
                    mlndlap_jacobi_c(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], const_sigma,
                                     dmskarr_ma[box_no], dxinvarr);
                });
            }
        }
        else if ((m_use_harmonic_average && mglev > 0) || m_use_mapped)
        {
            AMREX_D_TERM(MultiArray4<Real const> const& sxarr_ma = sigma[0]->const_arrays();,
                         MultiArray4<Real const> const& syarr_ma = sigma[1]->const_arrays();,
                         MultiArray4<Real const> const& szarr_ma = sigma[2]->const_arrays(););
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_ha(i,j,k,solarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                               is_rz,
#endif
                                               dxinvarr);
                    mlndlap_jacobi_ha(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]),
                                      dmskarr_ma[box_no], dxinvarr);
                });
            }
        }
        else
        {
            auto sarr_ma = sigma[0]->const_arrays();
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_aa(i,j,k,solarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                               is_rz,
#endif
                                               dxinvarr);
                    mlndlap_jacobi_aa(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], sarr_ma[box_no],
                                      dmskarr_ma[box_no], dxinvarr);
                });
            }
        }

        Gpu::streamSynchronize();
        if (m_smooth_num_sweeps > 1) nodalSync(amrlev, mglev, sol);
    }
    else // cpu
#endif
    {
        bool regular_coarsening = true;
        if (amrlev == 0 && mglev > 0)
        {
            regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
        }
        if (sigma[0] == nullptr) {
            AMREX_ALWAYS_ASSERT(regular_coarsening);
        }

        if (m_use_gauss_seidel)
        {
            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<Real const> const& starr = stencil->const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_sten(bx,solarr,rhsarr,starr,dmskarr);
                    }
                }
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_c(bx, solarr, rhsarr,
                                               const_sigma, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                               ,is_rz
#endif
                            );
                    }
                }
            }
            else if ( (m_use_harmonic_average && mglev > 0) || m_use_mapped )
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                                 Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                                 Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_ha(bx, solarr, rhsarr,
                                                AMREX_D_DECL(sxarr,syarr,szarr),
                                                dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                ,is_rz
#endif
                            );
                    }
                }
            }
            else
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {

                    const Box& bx = mfi.validbox();
                    Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    if ( regular_coarsening )
                    {
                        for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                            mlndlap_gauss_seidel_aa(bx, solarr, rhsarr,
                                                    sarr, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                   ,is_rz
#endif
                                 );
                        }
                    } else {
                        for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                            mlndlap_gauss_seidel_with_line_solve_aa(bx, solarr, rhsarr,
                                                                    sarr, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                                   ,is_rz
#endif
                                );
                        }
                    }
                }
            }

            nodalSync(amrlev, mglev, sol);
        }
        else
        {
            MultiFab Ax(sol.boxArray(), sol.DistributionMap(), 1, 0);
            Fapply(amrlev, mglev, Ax, sol);

            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<Real const> const& stenarr = stencil->const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_sten(bx,solarr,Axarr,rhsarr,stenarr,dmskarr);
                }
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_c (bx, solarr, Axarr, rhsarr, const_sigma,
                                      dmskarr, dxinvarr);
                }
            }
            else if ( (m_use_harmonic_average && mglev > 0) || m_use_mapped )
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                                 Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                                 Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_ha (bx, solarr, Axarr, rhsarr, AMREX_D_DECL(sxarr,syarr,szarr),
                                       dmskarr, dxinvarr);
                }
            }
            else
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_aa (bx, solarr, Axarr, rhsarr, sarr,
                                       dmskarr, dxinvarr);
                }
            }
        }
    }
}